

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_encoder_factory.cc
# Opt level: O0

PredictionSchemeMethod draco::GetPredictionMethodFromOptions(int att_id,EncoderOptions *options)

{
  undefined8 in_RSI;
  int pred_type;
  string *name;
  AttributeKey *in_stack_ffffffffffffffb0;
  DracoOptions<int> *in_stack_ffffffffffffffb8;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  PredictionSchemeMethod local_4;
  
  name = (string *)&local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_4 = DracoOptions<int>::GetAttributeInt
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,name,
                       (int)((ulong)in_RSI >> 0x20));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_4 == PREDICTION_UNDEFINED) {
    local_4 = PREDICTION_UNDEFINED;
  }
  else if ((local_4 < PREDICTION_DIFFERENCE) || (MESH_PREDICTION_GEOMETRIC_NORMAL < local_4)) {
    local_4 = PREDICTION_NONE;
  }
  return local_4;
}

Assistant:

PredictionSchemeMethod GetPredictionMethodFromOptions(
    int att_id, const EncoderOptions &options) {
  const int pred_type =
      options.GetAttributeInt(att_id, "prediction_scheme", -1);
  if (pred_type == -1) {
    return PREDICTION_UNDEFINED;
  }
  if (pred_type < 0 || pred_type >= NUM_PREDICTION_SCHEMES) {
    return PREDICTION_NONE;
  }
  return static_cast<PredictionSchemeMethod>(pred_type);
}